

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

int HRSS_decap(uint8_t *out_shared_key,HRSS_private_key *in_priv,uint8_t *ciphertext,
              size_t ciphertext_len)

{
  SHA256_CTX *c;
  poly *out;
  poly *ppVar1;
  poly *r;
  poly3 *out_00;
  poly3 *out_01;
  uint16_t *r_00;
  uint8_t *out_02;
  short sVar2;
  ushort uVar3;
  int iVar4;
  size_t i;
  POLY_MUL_SCRATCH *scratch;
  long lVar5;
  ulong *puVar6;
  ulong *puVar7;
  uint uVar8;
  poly3 *in;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint16_t v;
  uint uVar12;
  uint i_4;
  uint8_t m;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  void *malloc_ptr;
  uint8_t inner_digest [32];
  void *local_60;
  uchar local_58 [40];
  
  in = (poly3 *)(in_priv->opaque + (-(int)in_priv & 0xf));
  if (((ulong)in & 0xf) == 0) {
    scratch = (POLY_MUL_SCRATCH *)malloc_align32(&local_60,0xb050);
    if (scratch == (POLY_MUL_SCRATCH *)0x0) {
      RAND_bytes(out_shared_key,0x20);
      iVar4 = 0;
    }
    else {
      memset(scratch,0xff,0xb050);
      lVar5 = 0;
      do {
        scratch[1].u.rq[lVar5] = *(byte *)((long)in[10].s.v + lVar5) ^ 0x36;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      scratch[1].u.vec.prod[3][0] = 0x3636363636363636;
      scratch[1].u.vec.prod[3][1] = 0x3636363636363636;
      scratch[1].u.vec.prod[2][0] = 0x3636363636363636;
      scratch[1].u.vec.prod[2][1] = 0x3636363636363636;
      c = (SHA256_CTX *)((long)&scratch[1].u + 0x40);
      SHA256_Init(c);
      SHA256_Update(c,scratch + 1,0x40);
      SHA256_Update(c,ciphertext,ciphertext_len);
      SHA256_Final(local_58,c);
      lVar5 = 0x86e0;
      do {
        (scratch->u).rq[lVar5] = (scratch->u).rq[lVar5] ^ 0x6a;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x8700);
      scratch[1].u.vec.prod[3][0] = 0x5c5c5c5c5c5c5c5c;
      scratch[1].u.vec.prod[3][1] = 0x5c5c5c5c5c5c5c5c;
      scratch[1].u.vec.prod[2][0] = 0x5c5c5c5c5c5c5c5c;
      scratch[1].u.vec.prod[2][1] = 0x5c5c5c5c5c5c5c5c;
      SHA256_Init(c);
      SHA256_Update(c,scratch + 1,0x40);
      SHA256_Update(c,local_58,0x20);
      SHA256_Final(out_shared_key,c);
      if (ciphertext_len == 0x472) {
        out = (poly *)((long)&scratch[1].u + 0xb0);
        iVar4 = poly_unmarshal(out,ciphertext);
        if (iVar4 != 0) {
          ppVar1 = (poly *)((long)&scratch[1].u + 0x630);
          poly_from_poly3(ppVar1,in);
          r = (poly *)((long)&scratch[1].u + 0xbb0);
          poly_mul(scratch,r,out,ppVar1);
          out_00 = (poly3 *)((long)&scratch[1].u + 0x1130);
          poly3_from_poly(out_00,r);
          out_01 = (poly3 *)((long)&scratch[1].u + 0x11e0);
          HRSS_poly3_mul(out_01,out_00,in + 1);
          ppVar1 = (poly *)((long)&scratch[1].u + 0x1290);
          poly_from_poly3(ppVar1,out_01);
          poly_lift((poly *)((long)&scratch[1].u + 0x1810),ppVar1);
          lVar5 = 0x5238;
          do {
            *(short *)((long)&scratch->u + lVar5 * 2) =
                 *(short *)((long)scratch + lVar5 * 2 + -0x1ce0) -
                 *(short *)((long)scratch + lVar5 * 2 + -0x580);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x54f5);
          r_00 = (&scratch[1].u.novec)[1].prod + 0x428;
          *(undefined2 *)((long)&scratch[1].u + 0x230e) = 0;
          *(undefined4 *)((long)&scratch[1].u + 0x230a) = 0;
          poly_mul(scratch,(poly *)r_00,(poly *)r_00,(poly *)(in + 2));
          sVar2 = *(short *)((long)&scratch[1].u + 0x2308);
          lVar5 = 0;
          do {
            r_00[lVar5] = r_00[lVar5] - sVar2;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x2bd);
          lVar5 = 0;
          do {
            scratch[1].u.rq[lVar5 * 2 + 0x1d91] = scratch[1].u.rq[lVar5 * 2 + 0x1d91] & 0x1f;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x2bd);
          puVar6 = (ulong *)((long)&scratch[1].u + 0x2310);
          puVar7 = (ulong *)((long)&scratch[1].u + 0x2368);
          lVar5 = 0;
          uVar11 = 0;
          uVar10 = 0;
          iVar4 = 0;
          bVar13 = 0xff;
          do {
            uVar3 = r_00[lVar5];
            uVar8 = uVar3 & 2;
            uVar15 = uVar8 >> 1;
            uVar12 = uVar3 & 3 ^ uVar15;
            bVar14 = 0;
            if ((ushort)(-(short)uVar15 & 0x1fffU | (ushort)uVar12) == uVar3) {
              bVar14 = bVar13;
            }
            uVar9 = (ulong)uVar8 << 0x3e;
            uVar11 = uVar11 >> 1 | uVar9;
            uVar10 = uVar10 >> 1 | (ulong)uVar12 << 0x3f | uVar9;
            iVar4 = iVar4 + 1;
            if (iVar4 == 0x40) {
              *puVar6 = uVar11;
              puVar6 = puVar6 + 1;
              *puVar7 = uVar10;
              puVar7 = puVar7 + 1;
              iVar4 = 0;
              uVar10 = 0;
              uVar11 = 0;
            }
            lVar5 = lVar5 + 1;
            bVar13 = bVar14;
          } while (lVar5 != 0x2bd);
          *puVar6 = uVar11 >> (-(char)iVar4 & 0x3fU);
          *puVar7 = uVar10 >> (-(char)iVar4 & 0x3fU);
          out_02 = scratch[1].u.rq + 0x23c0;
          poly_marshal(out_02,out);
          poly_marshal_mod3(scratch[1].u.rq + 0x2832,ppVar1);
          poly_marshal_mod3(scratch[1].u.rq + 0x28be,(poly *)r_00);
          iVar4 = CRYPTO_memcmp(ciphertext,out_02,0x472);
          lVar5 = 0;
          if (iVar4 != 0) {
            bVar14 = 0;
          }
          SHA256_Init(c);
          SHA256_Update(c,"shared key",0xb);
          SHA256_Update(c,scratch[1].u.rq + 0x2832,0x8c);
          SHA256_Update(c,scratch[1].u.rq + 0x28be,0x8c);
          SHA256_Update(c,out_02,0x472);
          SHA256_Final(scratch[1].u.rq + 0x294a,c);
          do {
            out_shared_key[lVar5] =
                 out_shared_key[lVar5] & ~bVar14 | (scratch[1].u.rq + 0x294a)[lVar5] & bVar14;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x20);
        }
      }
      OPENSSL_free(local_60);
      iVar4 = 1;
    }
    return iVar4;
  }
  __assert_fail("((uintptr_t)ptr & (alignment - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/../internal.h"
                ,0xc0,"void *align_pointer(void *, size_t)");
}

Assistant:

int HRSS_decap(uint8_t out_shared_key[HRSS_KEY_BYTES],
               const struct HRSS_private_key *in_priv,
               const uint8_t *ciphertext, size_t ciphertext_len) {
  const struct private_key *priv =
      private_key_from_external((struct HRSS_private_key *)in_priv);

#if defined(_MSC_VER)
  // MSVC will produce this useless warning:
  // warning C4324: structure was padded due to alignment specifier
#pragma warning(push)
#pragma warning(disable : 4324)
#endif
  struct vars {
    struct POLY_MUL_SCRATCH scratch;
    uint8_t masked_key[SHA256_CBLOCK];
    SHA256_CTX hash_ctx;
    struct poly c;
    struct poly f, cf;
    struct poly3 cf3, m3;
    struct poly m, m_lifted;
    struct poly r;
    struct poly3 r3;
    uint8_t expected_ciphertext[HRSS_CIPHERTEXT_BYTES];
    uint8_t m_bytes[HRSS_POLY3_BYTES];
    uint8_t r_bytes[HRSS_POLY3_BYTES];
    uint8_t shared_key[32];
  };
#if defined(_MSC_VER)
#pragma warning(pop)
#endif

  void *malloc_ptr;
  struct vars *const vars = reinterpret_cast<struct vars *>(
      malloc_align32(&malloc_ptr, sizeof(struct vars)));
  if (!vars) {
    // If the caller ignores the return value the output will still be safe.
    // The private key output is randomised in case it's used to encrypt and
    // transmit something.
    RAND_bytes(out_shared_key, HRSS_KEY_BYTES);
    return 0;
  }

#if !defined(NDEBUG)
  OPENSSL_memset(vars, 0xff, sizeof(struct vars));
#endif

  // This is HMAC, expanded inline rather than using the |HMAC| function so that
  // we can avoid dealing with possible allocation failures and so keep this
  // function infallible.
  static_assert(sizeof(priv->hmac_key) <= sizeof(vars->masked_key),
                "HRSS HMAC key larger than SHA-256 block size");
  for (size_t i = 0; i < sizeof(priv->hmac_key); i++) {
    vars->masked_key[i] = priv->hmac_key[i] ^ 0x36;
  }
  OPENSSL_memset(vars->masked_key + sizeof(priv->hmac_key), 0x36,
                 sizeof(vars->masked_key) - sizeof(priv->hmac_key));

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, vars->masked_key, sizeof(vars->masked_key));
  SHA256_Update(&vars->hash_ctx, ciphertext, ciphertext_len);
  uint8_t inner_digest[SHA256_DIGEST_LENGTH];
  SHA256_Final(inner_digest, &vars->hash_ctx);

  for (size_t i = 0; i < sizeof(priv->hmac_key); i++) {
    vars->masked_key[i] ^= (0x5c ^ 0x36);
  }
  OPENSSL_memset(vars->masked_key + sizeof(priv->hmac_key), 0x5c,
                 sizeof(vars->masked_key) - sizeof(priv->hmac_key));

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, vars->masked_key, sizeof(vars->masked_key));
  SHA256_Update(&vars->hash_ctx, inner_digest, sizeof(inner_digest));
  static_assert(HRSS_KEY_BYTES == SHA256_DIGEST_LENGTH,
                "HRSS shared key length incorrect");
  SHA256_Final(out_shared_key, &vars->hash_ctx);

  // If the ciphertext is publicly invalid then a random shared key is still
  // returned to simply the logic of the caller, but this path is not constant
  // time.
  crypto_word_t ok = 0;
  if (ciphertext_len != HRSS_CIPHERTEXT_BYTES ||
      !poly_unmarshal(&vars->c, ciphertext)) {
    goto out;
  }

  poly_from_poly3(&vars->f, &priv->f);
  poly_mul(&vars->scratch, &vars->cf, &vars->c, &vars->f);
  poly3_from_poly(&vars->cf3, &vars->cf);
  // Note that cf3 is not reduced mod Φ(N). That reduction is deferred.
  HRSS_poly3_mul(&vars->m3, &vars->cf3, &priv->f_inverse);

  poly_from_poly3(&vars->m, &vars->m3);
  poly_lift(&vars->m_lifted, &vars->m);

  for (unsigned i = 0; i < N; i++) {
    vars->r.v[i] = vars->c.v[i] - vars->m_lifted.v[i];
  }
  poly_normalize(&vars->r);
  poly_mul(&vars->scratch, &vars->r, &vars->r, &priv->ph_inverse);
  poly_mod_phiN(&vars->r);
  poly_clamp(&vars->r);

  ok = poly3_from_poly_checked(&vars->r3, &vars->r);

  // [NTRUCOMP] section 5.1 includes ReEnc2 and a proof that it's valid. Rather
  // than do an expensive |poly_mul|, it rebuilds |c'| from |c - lift(m)|
  // (called |b|) with:
  //   t = (−b(1)/N) mod Q
  //   c' = b + tΦ(N) + lift(m) mod Q
  //
  // When polynomials are transmitted, the final coefficient is omitted and
  // |poly_unmarshal| sets it such that f(1) == 0. Thus c(1) == 0. Also,
  // |poly_lift| multiplies the result by (x-1) and therefore evaluating a
  // lifted polynomial at 1 is also zero. Thus lift(m)(1) == 0 and so
  // (c - lift(m))(1) == 0.
  //
  // Although we defer the reduction above, |b| is conceptually reduced mod
  // Φ(N). In order to do that reduction one subtracts |c[N-1]| from every
  // coefficient. Therefore b(1) = -c[N-1]×N. The value of |t|, above, then is
  // just recovering |c[N-1]|, and adding tΦ(N) is simply undoing the reduction.
  // Therefore b + tΦ(N) + lift(m) = c by construction and we don't need to
  // recover |c| at all so long as we do the checks in
  // |poly3_from_poly_checked|.
  //
  // The |poly_marshal| here then is just confirming that |poly_unmarshal| is
  // strict and could be omitted.

  static_assert(HRSS_CIPHERTEXT_BYTES == POLY_BYTES,
                "ciphertext is the wrong size");
  assert(ciphertext_len == sizeof(vars->expected_ciphertext));
  poly_marshal(vars->expected_ciphertext, &vars->c);

  poly_marshal_mod3(vars->m_bytes, &vars->m);
  poly_marshal_mod3(vars->r_bytes, &vars->r);

  ok &= constant_time_is_zero_w(
      CRYPTO_memcmp(ciphertext, vars->expected_ciphertext,
                    sizeof(vars->expected_ciphertext)));

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, kSharedKey, sizeof(kSharedKey));
  SHA256_Update(&vars->hash_ctx, vars->m_bytes, sizeof(vars->m_bytes));
  SHA256_Update(&vars->hash_ctx, vars->r_bytes, sizeof(vars->r_bytes));
  SHA256_Update(&vars->hash_ctx, vars->expected_ciphertext,
                sizeof(vars->expected_ciphertext));
  SHA256_Final(vars->shared_key, &vars->hash_ctx);

  for (unsigned i = 0; i < sizeof(vars->shared_key); i++) {
    out_shared_key[i] =
        constant_time_select_8(ok, vars->shared_key[i], out_shared_key[i]);
  }

out:
  OPENSSL_free(malloc_ptr);
  return 1;
}